

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase194::run(TestCase194 *this)

{
  StructBuilder *this_00;
  PointerReader reader;
  PointerReader reader_00;
  PointerReader reader_01;
  Reader reader_02;
  Builder builder_00;
  Reader reader_03;
  Reader reader_04;
  Reader reader_05;
  Builder reader_06;
  Reader reader_07;
  Reader reader_08;
  Reader reader_09;
  PointerReader reader_10;
  PointerReader reader_11;
  PointerReader reader_12;
  PointerBuilder builder_01;
  PointerBuilder builder_02;
  StructSchema SVar1;
  PointerBuilder builder_03;
  Builder builder_04;
  undefined4 uVar3;
  ulong uVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ListSchema LVar10;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  initializer_list<unsigned_int> expected_01;
  initializer_list<unsigned_int> expected_02;
  Fault f;
  BuilderFor<capnp::DynamicList> list;
  Builder root;
  MallocMessageBuilder builder;
  Fault local_420 [2];
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  undefined8 in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  undefined2 in_stack_fffffffffffffc0c;
  undefined2 in_stack_fffffffffffffc0e;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  PointerReader local_3d8;
  BuilderFor<AnyPointer> local_3b8;
  uint in_stack_fffffffffffffc64;
  undefined1 in_stack_fffffffffffffc68 [16];
  Builder local_378;
  ListElementCount local_348 [4];
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  StructReader local_228;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> local_1f8 [48];
  Reader local_1c8;
  Type local_188;
  SegmentReader *local_178;
  CapTableReader *pCStack_170;
  byte *local_168;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  anon_union_8_2_eba6ea51_for_Type_5 in_stack_fffffffffffffec0;
  SegmentReader *in_stack_fffffffffffffec8;
  CapTableReader *pCStack_130;
  byte *local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  MallocMessageBuilder local_108;
  size_type sVar2;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_420,&local_108.super_MessageBuilder);
  builder_01.capTable._0_4_ = in_stack_fffffffffffffc08;
  builder_01.segment = (SegmentBuilder *)in_stack_fffffffffffffc00;
  builder_01.capTable._4_2_ = in_stack_fffffffffffffc0c;
  builder_01.capTable._6_2_ = in_stack_fffffffffffffc0e;
  builder_01.pointer._0_4_ = in_stack_fffffffffffffc10;
  builder_01.pointer._4_4_ = in_stack_fffffffffffffc14;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (builder_01,(StructSchema)local_420[0].exception);
  name.content.size_ = 0x10;
  name.content.ptr = "anyPointerField";
  DynamicStruct::Builder::get((Builder *)local_420,&local_378,name);
  DynamicValue::Builder::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
            (&local_3b8,(Builder *)local_420);
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            (local_1f8,(EVP_PKEY_CTX *)(schemas::s_a0a8f314b80b63fd + 0x48));
  builder_04.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffea8;
  builder_04.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffea0;
  builder_04.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffeb0;
  builder_04.builder.data = (void *)in_stack_fffffffffffffeb8;
  builder_04.builder.pointers = (WirePointer *)in_stack_fffffffffffffec0.schema;
  builder_04.builder._32_8_ = in_stack_fffffffffffffec8;
  initDynamicTestMessage(builder_04);
  DynamicValue::Builder::~Builder((Builder *)local_420);
  SVar1.super_Schema.raw = local_378.schema.super_Schema.raw;
  this_00 = &local_378.builder;
  StructBuilder::asReader(this_00);
  local_420[0].exception = (Exception *)SVar1.super_Schema.raw;
  Schema::requireUsableAs((Schema *)local_420,(RawSchema *)&schemas::s_e3da5a2ccd28c0d8);
  bVar5 = in_stack_fffffffffffffc0c == 0;
  local_3b8.builder.pointer = (WirePointer *)in_stack_fffffffffffffc00;
  if (bVar5) {
    local_3b8.builder.pointer = (WirePointer *)(SegmentBuilder *)0x0;
  }
  uVar3 = 0x7fffffff;
  if (!bVar5) {
    uVar3 = in_stack_fffffffffffffc10;
  }
  uVar6 = 0;
  uVar7 = 0;
  local_3b8.builder.capTable._0_4_ = 0;
  local_3b8.builder.capTable._4_4_ = 0;
  if (!bVar5) {
    uVar6 = local_420[1].exception._0_4_;
    uVar7 = local_420[1].exception._4_4_;
    local_3b8.builder.capTable._0_4_ = in_stack_fffffffffffffbf0;
    local_3b8.builder.capTable._4_4_ = in_stack_fffffffffffffbf4;
  }
  local_3b8.builder.segment = (SegmentBuilder *)CONCAT44(uVar7,uVar6);
  PointerReader::getStruct(&local_228,(PointerReader *)&local_3b8,(word *)0x0);
  reader_02._reader.capTable = local_228.capTable;
  reader_02._reader.segment = local_228.segment;
  reader_02._reader.data = local_228.data;
  reader_02._reader.pointers = local_228.pointers;
  reader_02._reader.dataSize = local_228.dataSize;
  reader_02._reader.pointerCount = local_228.pointerCount;
  reader_02._reader._38_2_ = local_228._38_2_;
  reader_02._reader.nestingLimit = local_228.nestingLimit;
  reader_02._reader._44_4_ = local_228._44_4_;
  checkTestMessage(reader_02);
  SVar1.super_Schema.raw = local_378.schema.super_Schema.raw;
  StructBuilder::asReader(this_00);
  local_3b8.builder.segment = (SegmentBuilder *)SVar1.super_Schema.raw;
  name_00.content.size_ = 0x10;
  name_00.content.ptr = "anyPointerField";
  DynamicStruct::Reader::get((Reader *)local_420,(Reader *)&local_3b8,name_00);
  DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
            ((ReaderFor<AnyPointer> *)&local_3d8,(Reader *)local_420);
  reader_10.segment._4_4_ = in_stack_fffffffffffffbf4;
  reader_10.segment._0_4_ = in_stack_fffffffffffffbf0;
  reader_10.capTable = (CapTableReader *)in_stack_fffffffffffffbf8;
  reader_10.pointer = (WirePointer *)in_stack_fffffffffffffc00;
  reader_10.nestingLimit = in_stack_fffffffffffffc08;
  reader_10._28_2_ = in_stack_fffffffffffffc0c;
  reader_10._30_2_ = in_stack_fffffffffffffc0e;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (reader_10,(StructSchema)local_3d8.capTable);
  reader_03.reader.segment = (SegmentReader *)uStack_288;
  reader_03.schema.super_Schema.raw = (Schema)(Schema)local_290;
  reader_03.reader.capTable = (CapTableReader *)local_280;
  reader_03.reader.data = (void *)uStack_278;
  reader_03.reader.pointers = (WirePointer *)local_270;
  reader_03.reader.dataSize = (undefined4)uStack_268;
  reader_03.reader.pointerCount = uStack_268._4_2_;
  reader_03.reader._38_2_ = uStack_268._6_2_;
  reader_03.reader._40_8_ = local_260;
  checkDynamicTestMessage(reader_03);
  DynamicValue::Reader::~Reader((Reader *)local_420);
  SVar1.super_Schema.raw = local_378.schema.super_Schema.raw;
  StructBuilder::asReader(this_00);
  local_3b8.builder.segment = (SegmentBuilder *)SVar1.super_Schema.raw;
  name_01.content.size_ = 0x10;
  name_01.content.ptr = "anyPointerField";
  DynamicStruct::Reader::get((Reader *)local_420,(Reader *)&local_3b8,name_01);
  DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
            ((ReaderFor<AnyPointer> *)&local_3d8,(Reader *)local_420);
  reader_11.segment._4_4_ = in_stack_fffffffffffffbf4;
  reader_11.segment._0_4_ = in_stack_fffffffffffffbf0;
  reader_11.capTable = (CapTableReader *)in_stack_fffffffffffffbf8;
  reader_11.pointer = (WirePointer *)in_stack_fffffffffffffc00;
  reader_11.nestingLimit = in_stack_fffffffffffffc08;
  reader_11._28_2_ = in_stack_fffffffffffffc0c;
  reader_11._30_2_ = in_stack_fffffffffffffc0e;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (reader_11,(StructSchema)local_3d8.capTable);
  reader_04.reader.segment = (SegmentReader *)uStack_2c0;
  reader_04.schema.super_Schema.raw = (Schema)(Schema)local_2c8;
  reader_04.reader.capTable = (CapTableReader *)local_2b8;
  reader_04.reader.data = (void *)uStack_2b0;
  reader_04.reader.pointers = (WirePointer *)local_2a8;
  reader_04.reader.dataSize = (undefined4)uStack_2a0;
  reader_04.reader.pointerCount = uStack_2a0._4_2_;
  reader_04.reader._38_2_ = uStack_2a0._6_2_;
  reader_04.reader._40_8_ = local_298;
  checkDynamicTestMessage(reader_04);
  DynamicValue::Reader::~Reader((Reader *)local_420);
  name_02.content.size_ = 0x10;
  name_02.content.ptr = "anyPointerField";
  DynamicStruct::Builder::get((Builder *)local_420,&local_378,name_02);
  DynamicValue::Builder::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
            ((BuilderFor<AnyPointer> *)&local_3d8,(Builder *)local_420);
  PointerBuilder::asReader((PointerBuilder *)&local_3d8);
  SVar1.super_Schema.raw._4_4_ = local_3b8.builder.capTable._4_4_;
  SVar1.super_Schema.raw._0_4_ = local_3b8.builder.capTable._0_4_;
  reader_12.segment._4_4_ = in_stack_fffffffffffffbf4;
  reader_12.segment._0_4_ = in_stack_fffffffffffffbf0;
  reader_12.capTable = (CapTableReader *)in_stack_fffffffffffffbf8;
  reader_12.pointer = (WirePointer *)in_stack_fffffffffffffc00;
  reader_12.nestingLimit = in_stack_fffffffffffffc08;
  reader_12._28_2_ = in_stack_fffffffffffffc0c;
  reader_12._30_2_ = in_stack_fffffffffffffc0e;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic(reader_12,SVar1);
  reader_05.reader.segment = (SegmentReader *)uStack_2f8;
  reader_05.schema.super_Schema.raw = (Schema)(Schema)local_300;
  reader_05.reader.capTable = (CapTableReader *)local_2f0;
  reader_05.reader.data = (void *)uStack_2e8;
  reader_05.reader.pointers = (WirePointer *)local_2e0;
  reader_05.reader.dataSize = (undefined4)uStack_2d8;
  reader_05.reader.pointerCount = uStack_2d8._4_2_;
  reader_05.reader._38_2_ = uStack_2d8._6_2_;
  reader_05.reader._40_8_ = local_2d0;
  checkDynamicTestMessage(reader_05);
  DynamicValue::Builder::~Builder((Builder *)local_420);
  name_03.content.size_ = 0x10;
  name_03.content.ptr = "anyPointerField";
  DynamicStruct::Builder::get((Builder *)local_420,&local_378,name_03);
  DynamicValue::Builder::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
            (&local_3b8,(Builder *)local_420);
  builder_02.capTable._0_4_ = in_stack_fffffffffffffc08;
  builder_02.segment = (SegmentBuilder *)in_stack_fffffffffffffc00;
  builder_02.capTable._4_2_ = in_stack_fffffffffffffc0c;
  builder_02.capTable._6_2_ = in_stack_fffffffffffffc0e;
  builder_02.pointer._0_4_ = in_stack_fffffffffffffc10;
  builder_02.pointer._4_4_ = in_stack_fffffffffffffc14;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (builder_02,(StructSchema)local_3b8.builder.segment);
  builder_00.builder.segment = (SegmentBuilder *)uStack_250;
  builder_00.schema.super_Schema.raw = (Schema)(Schema)local_258;
  builder_00.builder.capTable = (CapTableBuilder *)local_248;
  builder_00.builder.data = (void *)uStack_240;
  builder_00.builder.pointers = (WirePointer *)local_238;
  builder_00.builder.dataSize = (undefined4)uStack_230;
  builder_00.builder.pointerCount = uStack_230._4_2_;
  builder_00.builder._38_2_ = uStack_230._6_2_;
  checkDynamicTestMessage(builder_00);
  DynamicValue::Builder::~Builder((Builder *)local_420);
  DynamicStruct::Builder::init((Builder *)local_420,(EVP_PKEY_CTX *)&local_378);
  DynamicValue::Builder::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
            ((BuilderFor<AnyPointer> *)&local_3d8,(Builder *)local_420);
  ListSchema::of(UINT32);
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::init((EVP_PKEY_CTX *)&local_3b8);
  DynamicValue::Builder::~Builder((Builder *)local_420);
  local_420[0].exception._0_4_ = INT;
  local_420[1].exception = (Exception *)0x7b;
  DynamicList::Builder::set((Builder *)&local_3b8,0,(Reader *)local_420);
  DynamicValue::Reader::~Reader((Reader *)local_420);
  local_420[0].exception._0_4_ = INT;
  local_420[1].exception = (Exception *)0x1c8;
  DynamicList::Builder::set((Builder *)&local_3b8,1,(Reader *)local_420);
  DynamicValue::Reader::~Reader((Reader *)local_420);
  local_420[0].exception._0_4_ = INT;
  local_420[1].exception = (Exception *)0x315;
  DynamicList::Builder::set((Builder *)&local_3b8,2,(Reader *)local_420);
  DynamicValue::Reader::~Reader((Reader *)local_420);
  local_420[0].exception._0_4_ = 3;
  local_420[1].exception = (Exception *)0x75bcd15;
  DynamicList::Builder::set((Builder *)&local_3b8,3,(Reader *)local_420);
  DynamicValue::Reader::~Reader((Reader *)local_420);
  SVar1.super_Schema.raw = local_378.schema.super_Schema.raw;
  StructBuilder::asReader(this_00);
  local_420[0].exception = (Exception *)SVar1.super_Schema.raw;
  Schema::requireUsableAs((Schema *)local_420,(RawSchema *)&schemas::s_e3da5a2ccd28c0d8);
  bVar5 = in_stack_fffffffffffffc0c == 0;
  local_3d8.pointer = (WirePointer *)in_stack_fffffffffffffc00;
  if (bVar5) {
    local_3d8.pointer = (WirePointer *)0x0;
  }
  local_3d8.nestingLimit = 0x7fffffff;
  if (!bVar5) {
    local_3d8.nestingLimit = in_stack_fffffffffffffc10;
  }
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  if (!bVar5) {
    uVar6 = local_420[1].exception._0_4_;
    uVar7 = local_420[1].exception._4_4_;
    uVar8 = in_stack_fffffffffffffbf0;
    uVar9 = in_stack_fffffffffffffbf4;
  }
  local_3d8.segment = (SegmentReader *)CONCAT44(uVar7,uVar6);
  local_3d8.capTable = (CapTableReader *)CONCAT44(uVar9,uVar8);
  PointerReader::getList((ListReader *)&local_3b8,&local_3d8,FOUR_BYTES,(word *)0x0);
  if (uVar3 == 4) {
    if (kj::_::Debug::minSeverity < 3 &&
        *(int *)&((SegmentReader *)&(local_3b8.builder.pointer)->offsetAndKind)->arena != 0x7b) {
      local_420[0].exception._0_4_ = 0x7b;
      local_3d8.segment =
           (SegmentReader *)
           CONCAT44(local_3d8.segment._4_4_,
                    *(undefined4 *)
                     &((SegmentReader *)&(local_3b8.builder.pointer)->offsetAndKind)->arena);
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xe7,ERROR,"\"failed: expected \" \"(123u) == (list[0])\", 123u, list[0]",
                 (char (*) [37])"failed: expected (123u) == (list[0])",(uint *)local_420,
                 (uint *)&local_3d8);
    }
    if (kj::_::Debug::minSeverity < 3 &&
        *(int *)((long)&((SegmentReader *)&(local_3b8.builder.pointer)->offsetAndKind)->arena +
                (ulong)(in_stack_fffffffffffffc64 >> 3)) != 0x1c8) {
      local_420[0].exception._0_4_ = 0x1c8;
      local_3d8.segment =
           (SegmentReader *)
           CONCAT44(local_3d8.segment._4_4_,
                    *(undefined4 *)
                     ((long)&((SegmentReader *)&(local_3b8.builder.pointer)->offsetAndKind)->arena +
                     (ulong)(in_stack_fffffffffffffc64 >> 3)));
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xe8,ERROR,"\"failed: expected \" \"(456u) == (list[1])\", 456u, list[1]",
                 (char (*) [37])"failed: expected (456u) == (list[1])",(uint *)local_420,
                 (uint *)&local_3d8);
    }
    if (kj::_::Debug::minSeverity < 3 &&
        *(int *)((long)&((SegmentReader *)&(local_3b8.builder.pointer)->offsetAndKind)->arena +
                (ulong)(in_stack_fffffffffffffc64 >> 2)) != 0x315) {
      local_420[0].exception._0_4_ = 0x315;
      local_3d8.segment =
           (SegmentReader *)
           CONCAT44(local_3d8.segment._4_4_,
                    *(undefined4 *)
                     ((long)&((SegmentReader *)&(local_3b8.builder.pointer)->offsetAndKind)->arena +
                     (ulong)(in_stack_fffffffffffffc64 >> 2)));
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xe9,ERROR,"\"failed: expected \" \"(789u) == (list[2])\", 789u, list[2]",
                 (char (*) [37])"failed: expected (789u) == (list[2])",(uint *)local_420,
                 (uint *)&local_3d8);
    }
    uVar4 = (ulong)in_stack_fffffffffffffc64 * 3 >> 3;
    if ((*(int *)((long)&((SegmentReader *)&(local_3b8.builder.pointer)->offsetAndKind)->arena +
                 uVar4) != 0x75bcd15) && (kj::_::Debug::minSeverity < 3)) {
      local_420[0].exception._0_4_ = 0x75bcd15;
      local_3d8.segment =
           (SegmentReader *)
           CONCAT44(local_3d8.segment._4_4_,
                    *(undefined4 *)
                     ((long)&((SegmentReader *)&(local_3b8.builder.pointer)->offsetAndKind)->arena +
                     uVar4));
      kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"(123456789u) == (list[3])\", 123456789u, list[3]",
                 (char (*) [43])"failed: expected (123456789u) == (list[3])",(uint *)local_420,
                 (uint *)&local_3d8);
    }
    SVar1.super_Schema.raw = (Schema)(Schema)local_378.schema;
    StructBuilder::asReader(this_00);
    local_3b8.builder.segment = (SegmentBuilder *)SVar1.super_Schema.raw;
    name_04.content.size_ = 0x10;
    name_04.content.ptr = "anyPointerField";
    DynamicStruct::Reader::get((Reader *)local_420,(Reader *)&local_3b8,name_04);
    DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
              ((ReaderFor<AnyPointer> *)&local_3d8,(Reader *)local_420);
    LVar10 = ListSchema::of(UINT32);
    sVar2 = LVar10.elementType._0_8_;
    reader._28_4_ = local_3d8._28_4_;
    reader.nestingLimit = local_3d8.nestingLimit;
    reader.capTable = local_3d8.capTable;
    reader.segment = local_3d8.segment;
    reader.pointer = local_3d8.pointer;
    PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
              ((Reader *)&stack0xfffffffffffffeb8,reader,LVar10);
    local_348[0] = 0x7b;
    local_348[1] = 0x1c8;
    local_348[2] = 0x315;
    local_348[3] = 0x75bcd15;
    reader_07.schema.elementType.field_4.schema = in_stack_fffffffffffffec0.schema;
    reader_07.schema.elementType.baseType = (Which)in_stack_fffffffffffffeb8;
    reader_07.schema.elementType.listDepth = SUB81(in_stack_fffffffffffffeb8,2);
    reader_07.schema.elementType.isImplicitParam = SUB81(in_stack_fffffffffffffeb8,3);
    reader_07.schema.elementType.field_3 = SUB82(in_stack_fffffffffffffeb8,4);
    reader_07.schema.elementType._6_2_ = SUB82(in_stack_fffffffffffffeb8,6);
    reader_07.reader.segment = in_stack_fffffffffffffec8;
    reader_07.reader.capTable = pCStack_130;
    reader_07.reader.ptr = local_128;
    reader_07.reader._24_8_ = uStack_120;
    reader_07.reader._32_8_ = local_118;
    reader_07.reader._40_8_ = uStack_110;
    expected._M_len = sVar2;
    expected._M_array = local_348;
    (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_07,expected);
    DynamicValue::Reader::~Reader((Reader *)local_420);
    StructBuilder::asReader(this_00);
    local_3b8.builder.segment = (SegmentBuilder *)local_378.schema.super_Schema.raw;
    name_05.content.size_ = 0x10;
    name_05.content.ptr = "anyPointerField";
    DynamicStruct::Reader::get((Reader *)local_420,(Reader *)&local_3b8,name_05);
    DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
              ((ReaderFor<AnyPointer> *)&local_3d8,(Reader *)local_420);
    LVar10 = ListSchema::of(UINT32);
    sVar2 = LVar10.elementType._0_8_;
    reader_00._28_4_ = local_3d8._28_4_;
    reader_00.nestingLimit = local_3d8.nestingLimit;
    reader_00.capTable = local_3d8.capTable;
    reader_00.segment = local_3d8.segment;
    reader_00.pointer = local_3d8.pointer;
    PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
              ((Reader *)&local_188,reader_00,LVar10);
    local_348[0] = 0x7b;
    local_348[1] = 0x1c8;
    local_348[2] = 0x315;
    local_348[3] = 0x75bcd15;
    reader_08.schema.elementType.field_4.schema = local_188.field_4.schema;
    reader_08.schema.elementType.baseType = local_188.baseType;
    reader_08.schema.elementType.listDepth = local_188.listDepth;
    reader_08.schema.elementType.isImplicitParam = local_188.isImplicitParam;
    reader_08.schema.elementType.field_3 = local_188.field_3;
    reader_08.schema.elementType._6_2_ = local_188._6_2_;
    reader_08.reader.segment = local_178;
    reader_08.reader.capTable = pCStack_170;
    reader_08.reader.ptr = local_168;
    reader_08.reader.elementCount = (ListElementCount)in_stack_fffffffffffffea0;
    reader_08.reader.step = SUB84(in_stack_fffffffffffffea0,4);
    reader_08.reader.structDataSize = (StructDataBitCount)in_stack_fffffffffffffea8;
    reader_08.reader.structPointerCount = SUB82(in_stack_fffffffffffffea8,4);
    reader_08.reader.elementSize = SUB81(in_stack_fffffffffffffea8,6);
    reader_08.reader._39_1_ = SUB81(in_stack_fffffffffffffea8,7);
    reader_08.reader.nestingLimit = (int)in_stack_fffffffffffffeb0;
    reader_08.reader._44_4_ = SUB84(in_stack_fffffffffffffeb0,4);
    expected_00._M_len = sVar2;
    expected_00._M_array = local_348;
    (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_08,expected_00)
    ;
    DynamicValue::Reader::~Reader((Reader *)local_420);
    name_06.content.size_ = 0x10;
    name_06.content.ptr = "anyPointerField";
    DynamicStruct::Builder::get((Builder *)local_420,&local_378,name_06);
    DynamicValue::Builder::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
              ((BuilderFor<AnyPointer> *)&local_3d8,(Builder *)local_420);
    PointerBuilder::asReader((PointerBuilder *)&local_3d8);
    LVar10 = ListSchema::of(UINT32);
    sVar2 = LVar10.elementType._0_8_;
    reader_01.capTable._4_4_ = local_3b8.builder.capTable._4_4_;
    reader_01.capTable._0_4_ = local_3b8.builder.capTable._0_4_;
    reader_01._28_4_ = in_stack_fffffffffffffc64;
    reader_01.nestingLimit = uVar3;
    reader_01.segment = &(local_3b8.builder.segment)->super_SegmentReader;
    reader_01.pointer = local_3b8.builder.pointer;
    PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(&local_1c8,reader_01,LVar10);
    local_348[0] = 0x7b;
    local_348[1] = 0x1c8;
    local_348[2] = 0x315;
    local_348[3] = 0x75bcd15;
    reader_09.schema.elementType.field_4.schema = local_1c8.schema.elementType.field_4.schema;
    reader_09.schema.elementType.baseType = local_1c8.schema.elementType.baseType;
    reader_09.schema.elementType.listDepth = local_1c8.schema.elementType.listDepth;
    reader_09.schema.elementType.isImplicitParam = local_1c8.schema.elementType.isImplicitParam;
    reader_09.schema.elementType.field_3 = local_1c8.schema.elementType.field_3;
    reader_09.schema.elementType._6_2_ = local_1c8.schema.elementType._6_2_;
    reader_09.reader.segment = local_1c8.reader.segment;
    reader_09.reader.capTable = local_1c8.reader.capTable;
    reader_09.reader.ptr = local_1c8.reader.ptr;
    reader_09.reader.elementCount = local_1c8.reader.elementCount;
    reader_09.reader.step = local_1c8.reader.step;
    reader_09.reader.structDataSize = local_1c8.reader.structDataSize;
    reader_09.reader.structPointerCount = local_1c8.reader.structPointerCount;
    reader_09.reader.elementSize = local_1c8.reader.elementSize;
    reader_09.reader._39_1_ = local_1c8.reader._39_1_;
    reader_09.reader.nestingLimit = local_1c8.reader.nestingLimit;
    reader_09.reader._44_4_ = local_1c8.reader._44_4_;
    expected_01._M_len = sVar2;
    expected_01._M_array = local_348;
    (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_09,expected_01)
    ;
    DynamicValue::Builder::~Builder((Builder *)local_420);
    name_07.content.size_ = 0x10;
    name_07.content.ptr = "anyPointerField";
    DynamicStruct::Builder::get((Builder *)local_420,&local_378,name_07);
    DynamicValue::Builder::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
              (&local_3b8,(Builder *)local_420);
    LVar10 = ListSchema::of(UINT32);
    sVar2 = LVar10.elementType._0_8_;
    LVar10.elementType.field_4.scopeId._4_4_ = local_3b8.builder.capTable._4_4_;
    LVar10.elementType.field_4.scopeId._0_4_ = local_3b8.builder.capTable._0_4_;
    builder_03.segment._4_4_ = in_stack_fffffffffffffc64;
    builder_03.segment._0_4_ = uVar3;
    builder_03.capTable = (CapTableBuilder *)in_stack_fffffffffffffc68._0_8_;
    builder_03.pointer = (WirePointer *)in_stack_fffffffffffffc68._8_8_;
    LVar10.elementType._0_8_ = local_3b8.builder.segment;
    PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(builder_03,LVar10);
    local_3d8.segment = (SegmentReader *)0x1c80000007b;
    local_3d8.capTable = (CapTableReader *)0x75bcd1500000315;
    reader_06.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)uStack_330;
    reader_06.schema.elementType.baseType = (undefined2)local_338;
    reader_06.schema.elementType.listDepth = local_338._2_1_;
    reader_06.schema.elementType.isImplicitParam = (bool)local_338._3_1_;
    reader_06.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_338._4_2_;
    reader_06.schema.elementType._6_2_ = local_338._6_2_;
    reader_06.builder.segment = (SegmentBuilder *)local_328;
    reader_06.builder.capTable = (CapTableBuilder *)uStack_320;
    reader_06.builder.ptr = (byte *)local_318;
    reader_06.builder.elementCount = (undefined4)uStack_310;
    reader_06.builder.step = uStack_310._4_4_;
    reader_06.builder.structDataSize = (undefined4)local_308;
    reader_06.builder.structPointerCount = local_308._4_2_;
    reader_06.builder.elementSize = local_308._6_1_;
    reader_06.builder._39_1_ = local_308._7_1_;
    expected_02._M_len = sVar2;
    expected_02._M_array = (iterator)&local_3d8;
    (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Builder>
              (reader_06,expected_02);
    DynamicValue::Builder::~Builder((Builder *)local_420);
    MallocMessageBuilder::~MallocMessageBuilder(&local_108);
    return;
  }
  local_3d8.segment = (SegmentReader *)CONCAT44(local_3d8.segment._4_4_,4);
  local_348[0] = uVar3;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            (local_420,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0xe6,FAILED,"(4u) == (list.size())","4u, list.size()",(uint *)&local_3d8,local_348);
  kj::_::Debug::Fault::fatal(local_420);
}

Assistant:

TEST(DynamicApi, DynamicAnyPointers) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<DynamicStruct>(Schema::from<test::TestAnyPointer>());

  initDynamicTestMessage(
      root.get("anyPointerField").as<AnyPointer>()
          .initAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkTestMessage(
      root.asReader().as<test::TestAnyPointer>().getAnyPointerField().getAs<TestAllTypes>());

  checkDynamicTestMessage(
      root.asReader().get("anyPointerField").as<AnyPointer>()
          .getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.asReader().get("anyPointerField").as<AnyPointer>()
          .getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.get("anyPointerField").as<AnyPointer>().asReader()
          .getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.get("anyPointerField").as<AnyPointer>()
          .getAs<DynamicStruct>(Schema::from<TestAllTypes>()));

  {
    {
      auto list = root.init("anyPointerField").as<AnyPointer>()
                      .initAs<DynamicList>(Schema::from<List<uint32_t>>(), 4);
      list.set(0, 123);
      list.set(1, 456);
      list.set(2, 789);
      list.set(3, 123456789);
    }

    {
      auto list = root.asReader().as<test::TestAnyPointer>()
          .getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(4u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
      EXPECT_EQ(123456789u, list[3]);
    }

    checkList<uint32_t>(
        root.asReader().get("anyPointerField").as<AnyPointer>()
            .getAs<DynamicList>(Schema::from<List<uint32_t>>()),
        {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(
        root.asReader().get("anyPointerField").as<AnyPointer>()
            .getAs<DynamicList>(Schema::from<List<uint32_t>>()),
        {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(
        root.get("anyPointerField").as<AnyPointer>().asReader()
            .getAs<DynamicList>(Schema::from<List<uint32_t>>()),
        {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(
        root.get("anyPointerField").as<AnyPointer>()
            .getAs<DynamicList>(Schema::from<List<uint32_t>>()),
        {123u, 456u, 789u, 123456789u});
  }
}